

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_string.c
# Opt level: O3

PVIP_BOOL PVIP_string_concat_number(PVIPString *str,double n)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  PVIP_BOOL PVar4;
  uint uVar5;
  ulong uVar6;
  char buf [1024];
  undefined8 uStack_410;
  char acStack_408 [1024];
  
  uStack_410 = 0x103338;
  uVar2 = snprintf(acStack_408,0x400,"%f");
  uVar6 = (ulong)uVar2;
  uVar5 = 1;
  if ((int)uVar2 < 1) {
    uVar5 = uVar2;
  }
  uVar2 = uVar2 + 1;
  do {
    uVar3 = uVar5;
    if ((int)uVar6 < 2) break;
    uVar2 = uVar2 - 1;
    lVar1 = uVar6 - 1;
    uVar6 = uVar6 - 1;
    uVar3 = uVar2;
  } while (acStack_408[lVar1] == '0');
  uStack_410 = 0x10336a;
  PVar4 = PVIP_string_concat(str,acStack_408,(long)(int)uVar3);
  return PVar4;
}

Assistant:

PVIP_BOOL PVIP_string_concat_number(PVIPString *str, double n) {
    char buf[1024];
    int res = snprintf(buf, sizeof(buf), "%f", n);
    for (; res>1; --res) { /* remove trailing zeros */
        if (buf[res-1]!='0') {
            break;
        }
    }
    return PVIP_string_concat(str, buf, res);
}